

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Messages.c
# Opt level: O0

void next_message(tgestate_t *state)

{
  undefined8 uVar1;
  uint8_t *puVar2;
  char *message;
  uint8_t *qp;
  tgestate_t *state_local;
  
  puVar2 = (state->messages).queue + 2;
  if ((state->messages).queue_pointer != puVar2) {
    (state->messages).current_character = messages_table[*puVar2];
    uVar1 = *(undefined8 *)((state->messages).queue + 10);
    *(undefined8 *)(state->messages).queue = *(undefined8 *)((state->messages).queue + 2);
    *(undefined8 *)((state->messages).queue + 8) = uVar1;
    (state->messages).queue_pointer = (state->messages).queue_pointer + -2;
    (state->messages).display_index = '\0';
  }
  return;
}

Assistant:

void next_message(tgestate_t *state)
{
  uint8_t    *qp;      /* was DE */
  const char *message; /* was HL */

  assert(state != NULL);

  qp = &state->messages.queue[2];
  if (state->messages.queue_pointer == qp)
    return; /* Queue pointer is at the start - nothing to display. */

  assert(*qp < message__LIMIT);

  message = messages_table[*qp];

  state->messages.current_character = message;

  /* Discard the first element. */
  memmove(&state->messages.queue[0], &state->messages.queue[2], 16); // FUTURE: Use message_queue_LENGTH.
  state->messages.queue_pointer -= 2;
  state->messages.display_index = 0;
}